

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lsthandl.c
# Opt level: O1

LispPTR N_OP_fmemb(LispPTR item,LispPTR tos)

{
  LispPTR LVar1;
  
  while( true ) {
    if ((*(ushort *)((ulong)(tos >> 8 & 0xfffffffe) + (long)MDStypetbl ^ 2) & 0x7ff) != 5) {
      if (tos != 0) {
        MachineState.tosvalue = tos;
        MachineState.errorexit = 1;
        return 0xffffffff;
      }
      return 0;
    }
    LVar1 = car(tos);
    if (LVar1 == item) break;
    tos = cdr(tos);
    if (MachineState.irqend == 0) {
      MachineState.errorexit = 1;
      MachineState.tosvalue = tos;
      return 0xfffffffe;
    }
  }
  return tos;
}

Assistant:

LispPTR N_OP_fmemb(LispPTR item, LispPTR tos) { /* OP 34Q */

  while (Listp(tos)) {
    if (item == car(tos)) return tos;
    tos = cdr(tos);
    /* if we get an interrupt, punt so we can handle it safely */
    if (!Irq_Stk_End) { TIMER_EXIT(tos); }
  }
  if (tos) ERROR_EXIT(tos);
  return tos;

}